

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O2

void basic_datatype_test_integral<unsigned_int,true>(string *name)

{
  int i;
  uint uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v;
  uint local_5c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  string local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar1 = 0; uVar1 != 4; uVar1 = uVar1 + 1) {
    local_5c = uVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,&local_5c);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  runtest_maybe_dobin<std::vector<unsigned_int,std::allocator<unsigned_int>>,true>
            (&local_40,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void basic_datatype_test_integral(std::string name) {
    std::vector<T> v;
    for(int i=0; i<4; i++) {
        v.push_back(i);
    }
    runtest_maybe_dobin<std::vector<T>, DoBinary>(name, v);
}